

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.h
# Opt level: O2

void __thiscall
rapidjson::
GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
::Parse(GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
        *this,Ch *uri,size_t len)

{
  Ch *pCVar1;
  long lVar2;
  SizeType SVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  size_t sVar7;
  size_t sVar8;
  
  Allocate(this,len);
  if (len != 0) {
    sVar7 = 0;
    uVar6 = 0;
LAB_0011b2f2:
    if (len != uVar6) {
      if (uri[uVar6] != ':') goto code_r0x0011b2fe;
      if (len != uVar6) {
        uVar4 = 0;
        while ((uVar5 = len, len != uVar4 &&
               ((0x3f < (ulong)(byte)uri[uVar4] ||
                (uVar5 = uVar4, (0x8000800800000000U >> ((ulong)(byte)uri[uVar4] & 0x3f) & 1) == 0))
               ))) {
          uVar4 = uVar4 + 1;
        }
        if (uVar5 <= uVar6) goto LAB_0011b34b;
        sVar7 = uVar6 + 1;
        memcpy(this->scheme_,uri,sVar7);
        this->scheme_[uVar6 + 1] = '\0';
        goto LAB_0011b34e;
      }
      goto LAB_0011b34b;
    }
    goto LAB_0011b34e;
  }
LAB_0011b34b:
  sVar7 = 0;
LAB_0011b34e:
  pCVar1 = this->scheme_;
  SVar3 = GetSchemeStringLength(this);
  this->auth_ = pCVar1 + (ulong)SVar3 + 1;
  pCVar1[(ulong)SVar3 + 1] = '\0';
  uVar6 = sVar7;
  if (((sVar7 < len - 1) && (uri[sVar7] == '/')) && ((uri + sVar7)[1] == '/')) {
    uVar4 = sVar7 + 2;
    uVar5 = uVar4;
    if (uVar4 < len) {
      uVar5 = len;
    }
    while ((uVar6 = uVar5, uVar4 < len &&
           ((0x3f < (ulong)(byte)uri[uVar4] ||
            (uVar6 = uVar4, (0x8000800800000000U >> ((ulong)(byte)uri[uVar4] & 0x3f) & 1) == 0)))))
    {
      uVar4 = uVar4 + 1;
    }
    memcpy(this->auth_,uri + sVar7,uVar6 - sVar7);
    this->auth_[uVar6 - sVar7] = '\0';
  }
  pCVar1 = this->auth_;
  SVar3 = GetAuthStringLength(this);
  this->path_ = pCVar1 + (ulong)SVar3 + 1;
  pCVar1[(ulong)SVar3 + 1] = '\0';
  uVar4 = uVar6;
  if (uVar6 < len) {
    for (; ((uVar5 = len, uVar4 < len && (uVar5 = uVar4, uri[uVar4] != '#')) && (uri[uVar4] != '?'))
        ; uVar4 = uVar4 + 1) {
    }
    sVar7 = uVar5 - uVar6;
    if (sVar7 != 0) {
      memcpy(this->path_,uri + uVar6,sVar7);
      this->path_[sVar7] = '\0';
      uVar6 = uVar5;
      if (*this->path_ == '/') {
        RemoveDotSegments(this);
      }
    }
  }
  pCVar1 = this->path_;
  SVar3 = GetPathStringLength(this);
  this->query_ = pCVar1 + (ulong)SVar3 + 1;
  pCVar1[(ulong)SVar3 + 1] = '\0';
  if ((uVar6 < len) && (uri[uVar6] == '?')) {
    uVar4 = uVar6;
    do {
      uVar5 = uVar4 + 1;
      sVar8 = len;
      if (len <= uVar5) break;
      lVar2 = uVar4 + 1;
      uVar4 = uVar5;
      sVar8 = uVar5;
    } while (uri[lVar2] != '#');
    sVar7 = sVar8 - uVar6;
    if (sVar7 != 0) {
      memcpy(this->query_,uri + uVar6,sVar7);
      this->query_[sVar7] = '\0';
      uVar6 = sVar8;
    }
  }
  pCVar1 = this->query_;
  SVar3 = GetQueryStringLength(this);
  this->frag_ = pCVar1 + (ulong)SVar3 + 1;
  pCVar1[(ulong)SVar3 + 1] = '\0';
  sVar7 = len - uVar6;
  if ((uVar6 <= len && sVar7 != 0) && (uri[uVar6] == '#')) {
    memcpy(this->frag_,uri + uVar6,sVar7);
    this->frag_[sVar7] = '\0';
  }
  pCVar1 = this->frag_;
  SVar3 = GetFragStringLength(this);
  this->base_ = pCVar1 + (ulong)SVar3 + 1;
  SetBase(this);
  pCVar1 = this->base_;
  SVar3 = GetBaseStringLength(this);
  this->uri_ = pCVar1 + (ulong)SVar3 + 1;
  SetUri(this);
  return;
code_r0x0011b2fe:
  uVar6 = uVar6 + 1;
  goto LAB_0011b2f2;
}

Assistant:

void Parse(const Ch* uri, std::size_t len) {
        std::size_t start = 0, pos1 = 0, pos2 = 0;
        Allocate(len);

        // Look for scheme ([^:/?#]+):)?
        if (start < len) {
            while (pos1 < len) {
                if (uri[pos1] == ':') break;
                pos1++;
            }
            if (pos1 != len) {
                while (pos2 < len) {
                    if (uri[pos2] == '/') break;
                    if (uri[pos2] == '?') break;
                    if (uri[pos2] == '#') break;
                    pos2++;
                }
                if (pos1 < pos2) {
                    pos1++;
                    std::memcpy(scheme_, &uri[start], pos1 * sizeof(Ch));
                    scheme_[pos1] = '\0';
                    start = pos1;
                }
            }
        }
        // Look for auth (//([^/?#]*))?
        // Note need to set, increment, assign in 3 stages to avoid compiler warning bug.
        auth_ = scheme_ + GetSchemeStringLength();
        auth_++;
        *auth_ = '\0';
        if (start < len - 1 && uri[start] == '/' && uri[start + 1] == '/') {
            pos2 = start + 2;
            while (pos2 < len) {
                if (uri[pos2] == '/') break;
                if (uri[pos2] == '?') break;
                if (uri[pos2] == '#') break;
                pos2++;
            }
            std::memcpy(auth_, &uri[start], (pos2 - start) * sizeof(Ch));
            auth_[pos2 - start] = '\0';
            start = pos2;
        }
        // Look for path ([^?#]*)
        // Note need to set, increment, assign in 3 stages to avoid compiler warning bug.
        path_ = auth_ + GetAuthStringLength();
        path_++;
        *path_ = '\0';
        if (start < len) {
            pos2 = start;
            while (pos2 < len) {
                if (uri[pos2] == '?') break;
                if (uri[pos2] == '#') break;
                pos2++;
            }
            if (start != pos2) {
                std::memcpy(path_, &uri[start], (pos2 - start) * sizeof(Ch));
                path_[pos2 - start] = '\0';
                if (path_[0] == '/')
                    RemoveDotSegments();   // absolute path - normalize
                start = pos2;
            }
        }
        // Look for query (\?([^#]*))?
        // Note need to set, increment, assign in 3 stages to avoid compiler warning bug.
        query_ = path_ + GetPathStringLength();
        query_++;
        *query_ = '\0';
        if (start < len && uri[start] == '?') {
            pos2 = start + 1;
            while (pos2 < len) {
                if (uri[pos2] == '#') break;
                pos2++;
            }
            if (start != pos2) {
                std::memcpy(query_, &uri[start], (pos2 - start) * sizeof(Ch));
                query_[pos2 - start] = '\0';
                start = pos2;
            }
        }
        // Look for fragment (#(.*))?
        // Note need to set, increment, assign in 3 stages to avoid compiler warning bug.
        frag_ = query_ + GetQueryStringLength();
        frag_++;
        *frag_ = '\0';
        if (start < len && uri[start] == '#') {
            std::memcpy(frag_, &uri[start], (len - start) * sizeof(Ch));
            frag_[len - start] = '\0';
        }

        // Re-constitute base_ and uri_
        base_ = frag_ + GetFragStringLength() + 1;
        SetBase();
        uri_ = base_ + GetBaseStringLength() + 1;
        SetUri();
    }